

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_waveops.cpp
# Opt level: O1

Id dxil_spv::build_masked_ballot(Impl *impl,Id input_value)

{
  Id IVar1;
  Builder *this;
  Operation *pOVar2;
  Operation *this_00;
  Id local_40;
  Id local_3c;
  initializer_list<unsigned_int> local_38;
  
  this = Converter::Impl::builder(impl);
  IVar1 = spv::Builder::makeBoolType(this);
  pOVar2 = Converter::Impl::allocate(impl,OpIsHelperInvocationEXT,IVar1);
  Converter::Impl::add(impl,pOVar2,false);
  IVar1 = spv::Builder::makeBoolType(this);
  this_00 = Converter::Impl::allocate(impl,OpLogicalNot,IVar1);
  Operation::add_id(this_00,pOVar2->id);
  Converter::Impl::add(impl,this_00,false);
  IVar1 = spv::Builder::makeBoolType(this);
  pOVar2 = Converter::Impl::allocate(impl,OpLogicalAnd,IVar1);
  local_38._M_array = &local_40;
  local_3c = this_00->id;
  local_38._M_len = 2;
  local_40 = input_value;
  Operation::add_ids(pOVar2,&local_38);
  Converter::Impl::add(impl,pOVar2,false);
  return pOVar2->id;
}

Assistant:

static spv::Id build_masked_ballot(Converter::Impl &impl, spv::Id input_value)
{
	auto &builder = impl.builder();

	auto *is_helper = impl.allocate(spv::OpIsHelperInvocationEXT, builder.makeBoolType());
	impl.add(is_helper);

	auto *is_active = impl.allocate(spv::OpLogicalNot, builder.makeBoolType());
	is_active->add_id(is_helper->id);
	impl.add(is_active);

	auto *is_active_ballot = impl.allocate(spv::OpLogicalAnd, builder.makeBoolType());
	is_active_ballot->add_ids({ input_value, is_active->id });
	impl.add(is_active_ballot);

	return is_active_ballot->id;
}